

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checking.cc
# Opt level: O0

void __thiscall
dtc::fdt::checking::check_manager::
add_property_type_checker<(dtc::fdt::property_value::value_type)1>
          (check_manager *this,char *name,string *prop)

{
  property_type_checker<(dtc::fdt::property_value::value_type)1> *this_00;
  property_type_checker<(dtc::fdt::property_value::value_type)1> *local_88 [3];
  allocator<char> local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)1>_*>
  local_48;
  string *local_20;
  string *prop_local;
  char *name_local;
  check_manager *this_local;
  
  local_20 = prop;
  prop_local = (string *)name;
  name_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,name,&local_69);
  this_00 = (property_type_checker<(dtc::fdt::property_value::value_type)1> *)operator_new(0x48);
  property_type_checker<(dtc::fdt::property_value::value_type)1>::property_type_checker
            (this_00,(char *)prop_local,local_20);
  local_88[0] = this_00;
  std::
  make_pair<std::__cxx11::string,dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)1>*>
            (&local_48,&local_68,local_88);
  std::
  unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
  ::
  insert<std::pair<std::__cxx11::string,dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)1>*>>
            ((unordered_map<std::__cxx11::string,dtc::fdt::checking::checker*,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,dtc::fdt::checking::checker*>>>
              *)this,&local_48);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_dtc::fdt::checking::property_type_checker<(dtc::fdt::property_value::value_type)1>_*>
  ::~pair(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

void
check_manager::add_property_type_checker(const char *name, const string &prop)
{
	checkers.insert(std::make_pair(string(name),
		new property_type_checker<T>(name, prop)));
}